

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::SwiftCompilerShellCommand::constructCommandLineArgs
          (SwiftCompilerShellCommand *this,StringRef outputFileMapPath,
          vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *result)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *pvVar1;
  bool bVar2;
  ulong uVar3;
  value_type local_328;
  reference local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  size_t local_2f0;
  value_type local_2e8;
  reference local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *import;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  size_t local_2b0;
  reference local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  size_t local_280;
  value_type local_278;
  value_type local_268;
  value_type local_258;
  value_type local_248;
  value_type local_238;
  value_type local_228;
  value_type local_218;
  value_type local_208;
  value_type local_1f8;
  value_type local_1e8;
  value_type local_1d8;
  value_type local_1c8;
  reference local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nameAndAlias;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  size_t local_190;
  value_type local_188;
  value_type local_178;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *local_168;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *result_local;
  SwiftCompilerShellCommand *this_local;
  StringRef outputFileMapPath_local;
  
  outputFileMapPath_local.Data = (char *)outputFileMapPath.Length;
  this_local = (SwiftCompilerShellCommand *)outputFileMapPath.Data;
  outputFileMapPath_local.Length = (size_t)&this->executable;
  local_168 = result;
  result_local = (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)this;
  local_178.Data = (char *)std::__cxx11::string::data();
  local_178.Length = std::__cxx11::string::length();
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(result,&local_178);
  pvVar1 = local_168;
  local_188.Data = "-module-name";
  local_188.Length = strlen("-module-name");
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_188);
  pvVar1 = local_168;
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::__cxx11::string::data();
  local_190 = std::__cxx11::string::length();
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
            (pvVar1,(value_type *)&__range2);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->moduleAliases);
  nameAndAlias = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->moduleAliases);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&nameAndAlias), pvVar1 = local_168, bVar2) {
    local_1b8 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
    pvVar1 = local_168;
    local_1c8.Data = "-module-alias";
    local_1c8.Length = strlen("-module-alias");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_1c8);
    pvVar1 = local_168;
    local_1d8.Data = (char *)std::__cxx11::string::data();
    local_1d8.Length = std::__cxx11::string::length();
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_1d8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  local_1e8.Data = "-emit-dependencies";
  local_1e8.Length = strlen("-emit-dependencies");
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_1e8);
  uVar3 = std::__cxx11::string::empty();
  pvVar1 = local_168;
  if ((uVar3 & 1) == 0) {
    local_1f8.Data = "-emit-module";
    local_1f8.Length = strlen("-emit-module");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_1f8);
    pvVar1 = local_168;
    local_208.Data = "-emit-module-path";
    local_208.Length = strlen("-emit-module-path");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_208);
    pvVar1 = local_168;
    local_218.Data = (char *)std::__cxx11::string::data();
    local_218.Length = std::__cxx11::string::length();
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_218);
  }
  pvVar1 = local_168;
  local_228.Data = "-output-file-map";
  local_228.Length = strlen("-output-file-map");
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_228);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
            (local_168,(value_type *)&this_local);
  pvVar1 = local_168;
  if ((this->isLibrary & 1U) != 0) {
    local_238.Data = "-parse-as-library";
    local_238.Length = strlen("-parse-as-library");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_238);
  }
  pvVar1 = local_168;
  if ((this->enableWholeModuleOptimization & 1U) == 0) {
    local_278.Data = "-incremental";
    local_278.Length = strlen("-incremental");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_278);
  }
  else {
    local_248.Data = "-whole-module-optimization";
    local_248.Length = strlen("-whole-module-optimization");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_248);
    pvVar1 = local_168;
    local_258.Data = "-num-threads";
    local_258.Length = strlen("-num-threads");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_258);
    pvVar1 = local_168;
    local_268.Data = (char *)std::__cxx11::string::data();
    local_268.Length = std::__cxx11::string::length();
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_268);
  }
  pvVar1 = local_168;
  __range2_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)anon_var_dwarf_25d889;
  local_280 = strlen("-c");
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
            (pvVar1,(value_type *)&__range2_1);
  __end2_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->sourcesList);
  source = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->sourcesList);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&source), bVar2) {
    local_2a8 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2_1);
    pvVar1 = local_168;
    __range2_2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::data();
    local_2b0 = std::__cxx11::string::length();
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (pvVar1,(value_type *)&__range2_2);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->importPaths);
  import = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->importPaths);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&import), bVar2) {
    local_2d8 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2_2);
    pvVar1 = local_168;
    local_2e8.Data = "-I";
    local_2e8.Length = strlen("-I");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_2e8);
    pvVar1 = local_168;
    __range2_3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::data();
    local_2f0 = std::__cxx11::string::length();
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (pvVar1,(value_type *)&__range2_3);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_2);
  }
  __end2_3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->otherArgs);
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->otherArgs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_3,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&arg), bVar2) {
    local_318 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2_3);
    pvVar1 = local_168;
    local_328.Data = (char *)std::__cxx11::string::data();
    local_328.Length = std::__cxx11::string::length();
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_328);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_3);
  }
  return;
}

Assistant:

void constructCommandLineArgs(StringRef outputFileMapPath,
                                std::vector<StringRef>& result) const {
    result.push_back(executable);
    result.push_back("-module-name");
    result.push_back(moduleName);

    for (const auto& nameAndAlias: moduleAliases) {
      // E.g. `-module-alias Foo=Bar`
      result.push_back("-module-alias");
      result.push_back(nameAndAlias);
    }

    result.push_back("-emit-dependencies");
    if (!moduleOutputPath.empty()) {
      result.push_back("-emit-module");
      result.push_back("-emit-module-path");
      result.push_back(moduleOutputPath);
    }
    result.push_back("-output-file-map");
    result.push_back(outputFileMapPath);
    if (isLibrary) {
      result.push_back("-parse-as-library");
    }
    if (enableWholeModuleOptimization) {
      result.push_back("-whole-module-optimization");
      result.push_back("-num-threads");
      result.push_back(numThreads);
    } else {
      result.push_back("-incremental");
    }
    result.push_back("-c");
    for (const auto& source: sourcesList) {
      result.push_back(source);
    }
    for (const auto& import: importPaths) {
      result.push_back("-I");
      result.push_back(import);
    }
    for (const auto& arg: otherArgs) {
      result.push_back(arg);
    }
  }